

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

int skynet_send(skynet_context *context,uint32_t source,uint32_t destination,int type,int session,
               void *data,size_t sz)

{
  void *__ptr;
  int iVar1;
  remote_message *rmsg;
  int iVar2;
  skynet_message smsg;
  int local_4c;
  void *local_48;
  skynet_message local_40;
  
  local_4c = session;
  local_48 = data;
  if (sz._7_1_ == '\0') {
    _filter_args(context,type,&local_4c,&local_48,&sz);
    if (source == 0) {
      source = context->handle;
    }
    iVar2 = local_4c;
    if (destination != 0) {
      iVar1 = skynet_harbor_message_isremote(destination);
      __ptr = local_48;
      iVar2 = local_4c;
      if (iVar1 == 0) {
        local_40.session = local_4c;
        local_40.data = local_48;
        local_40.sz = CONCAT17(sz._7_1_,(undefined7)sz);
        local_40.source = source;
        iVar1 = skynet_context_push(destination,&local_40);
        if (iVar1 != 0) {
          free(__ptr);
          iVar2 = -1;
        }
      }
      else {
        rmsg = (remote_message *)malloc(0x28);
        iVar2 = local_4c;
        (rmsg->destination).handle = destination;
        rmsg->message = local_48;
        rmsg->sz = CONCAT17(sz._7_1_,(undefined7)sz);
        skynet_harbor_send(rmsg,source,local_4c);
      }
    }
  }
  else {
    skynet_error(context,"The message to %x is too large",(ulong)destination);
    iVar2 = -1;
    if (((uint)type >> 0x10 & 1) != 0) {
      free(data);
    }
  }
  return iVar2;
}

Assistant:

int
skynet_send(struct skynet_context * context, uint32_t source, uint32_t destination , int type, int session, void * data, size_t sz) {
	if ((sz & MESSAGE_TYPE_MASK) != sz) {
		skynet_error(context, "The message to %x is too large", destination);
		if (type & PTYPE_TAG_DONTCOPY) {
			skynet_free(data);
		}
		return -1;
	}
	_filter_args(context, type, &session, (void **)&data, &sz);

	if (source == 0) {
		source = context->handle;
	}

	if (destination == 0) {
		return session;
	}
	if (skynet_harbor_message_isremote(destination)) {
		struct remote_message * rmsg = skynet_malloc(sizeof(*rmsg));
		rmsg->destination.handle = destination;
		rmsg->message = data;
		rmsg->sz = sz;
		skynet_harbor_send(rmsg, source, session);
	} else {
		struct skynet_message smsg;
		smsg.source = source;
		smsg.session = session;
		smsg.data = data;
		smsg.sz = sz;

		if (skynet_context_push(destination, &smsg)) {
			skynet_free(data);
			return -1;
		}
	}
	return session;
}